

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithmeticSubtermGeneralization.cpp
# Opt level: O0

Result Inferences::
       generalizeBottomUp<Inferences::EvaluatePolynom<Inferences::AdditionGeneralizationImpl::Generalize>>
                 (Clause *cl,
                 EvaluatePolynom<Inferences::AdditionGeneralizationImpl::Generalize> eval)

{
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  i;
  anon_class_24_3_4b77cd38_for__func f;
  undefined8 extraout_RDX;
  Clause *in_RDI;
  Result RVar1;
  bool redundant;
  Inference inf;
  Stack<Kernel::Literal_*> stack;
  bool allLessEq;
  bool oneLess;
  SimplifyingInference1 *si;
  Inference *this;
  Clause *in_stack_fffffffffffffe90;
  byte local_151;
  undefined8 in_stack_fffffffffffffec0;
  undefined8 local_138;
  IterTraits<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:90:10),_Kernel::Literal_*>_>
  *in_stack_fffffffffffffee8;
  Clause *in_stack_ffffffffffffff10;
  undefined8 local_e8;
  undefined8 in_stack_ffffffffffffff20;
  SplitSet *in_stack_ffffffffffffff28;
  bool *in_stack_ffffffffffffff30;
  Inference *local_c8;
  Stack<Kernel::Literal_*> *pSStack_c0;
  undefined1 local_88 [110];
  byte local_1a;
  undefined1 local_19 [9];
  Clause *local_10;
  byte local_8;
  
  si = (SimplifyingInference1 *)&stack0x00000008;
  local_19[0] = 0;
  local_1a = 1;
  local_19._1_8_ = in_RDI;
  Kernel::Clause::iterLits(in_stack_fffffffffffffe90);
  i._iter._inner._0_8_ = local_88;
  i._iter._func.a = (Clause *)si;
  i._iter._16_8_ = in_stack_fffffffffffffec0;
  Lib::
  iterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>>
            (i);
  this = (Inference *)local_19;
  f.oneLess = (bool *)in_stack_ffffffffffffff28;
  f.eval = (EvaluateMonom<Inferences::NumeralMultiplicationGeneralizationImpl::Generalize> *)
           in_stack_ffffffffffffff20;
  f.allLessEq = in_stack_ffffffffffffff30;
  Lib::
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::{lambda(auto:1)#1},Kernel::Literal*&>>>
  ::
  map<Inferences::generalizeBottomUp<Inferences::EvaluatePolynom<Inferences::AdditionGeneralizationImpl::Generalize>>(Kernel::Clause*,Inferences::EvaluatePolynom<Inferences::AdditionGeneralizationImpl::Generalize>)::_lambda(Kernel::Literal*)_1_>
            ((IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>_>
              *)in_stack_ffffffffffffff10,f);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:90:10),_Kernel::Literal_*>_>
  ::collect<Lib::Stack>(in_stack_fffffffffffffee8);
  Kernel::SimplifyingInference1::SimplifyingInference1
            ((SimplifyingInference1 *)&stack0xffffffffffffff08,ARITHMETIC_SUBTERM_GENERALIZATION,
             (Clause *)local_19._1_8_);
  Kernel::Inference::Inference(this,si);
  local_151 = 0;
  if ((local_1a & 1) != 0) {
    local_151 = local_19[0];
  }
  *(int *)(DAT_01333840 + 0x17c) = *(int *)(DAT_01333840 + 0x17c) + 1;
  if ((local_151 & 1) == 0) {
    *(int *)(DAT_01333840 + 0x178) = *(int *)(DAT_01333840 + 0x178) + 1;
  }
  local_138 = local_e8;
  local_10 = Kernel::Clause::fromStack(pSStack_c0,local_c8);
  local_8 = local_151 & 1;
  Kernel::Inference::~Inference((Inference *)&stack0xfffffffffffffec8);
  Kernel::Inference::~Inference((Inference *)&stack0xffffffffffffff18);
  Lib::Stack<Kernel::Literal_*>::~Stack((Stack<Kernel::Literal_*> *)this);
  RVar1._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  RVar1.premiseRedundant = (bool)local_8;
  RVar1.simplified = local_10;
  return RVar1;
}

Assistant:

SimplifyingGeneratingInference1::Result generalizeBottomUp(Clause* cl, EvalFn eval) 
{
  /* apply the selectedGen generalization */
  DEBUG_CODE(bool anyChange = false);
  bool oneLess = false;
  bool allLessEq = true;

  auto stack = iterTraits(cl->iterLits())
    .map([&](Literal* lit) -> Literal* {
        unsigned j = 0;
        auto termArgs = termArgIter(lit)
          .map([&](TermList term) -> TermList { 
              auto norm = PolyNf::normalize(TypedTermList(term, SortHelper::getTermArgSort(lit, j++)));
              auto res = BottomUpEvaluation<typename EvalFn::Arg, typename EvalFn::Result>().function(eval).apply(norm);
              if (res != norm) {
                DEBUG_CODE(anyChange = true);
                DEBUG("generalized: ", norm, " -> ", res);
                return res.denormalize();
              } else {
                return term;
              }
          });
        auto args = concatIters(typeArgIter(lit), termArgs)
              .template collect<Stack>();

        auto generalizedLit = Literal::create(
            lit, 
            args.begin());

        if (eval.eval.doOrderingCheck) {

          auto ord = Ordering::tryGetGlobalOrdering();
          ASS(ord)
          auto cmp = ord->compare(generalizedLit, lit);
          switch(cmp) {
            case Ordering::LESS:
              oneLess = true;
              break;
            case Ordering::EQUAL:
              break;
            case Ordering::GREATER:
            case Ordering::INCOMPARABLE:
              allLessEq = false;
              DEBUG("ordering violation: ", cmp)
              DEBUG("original   : ", *lit)
              DEBUG("generalized: ", *generalizedLit)
              break;
          }
        }
        return generalizedLit;
    })
    .template collect<Stack>();

  ASS(anyChange)
  Inference inf(SimplifyingInference1(Kernel::InferenceRule::ARITHMETIC_SUBTERM_GENERALIZATION, cl));
  bool redundant = allLessEq && oneLess;
  env.statistics->asgCnt++;
  if (!redundant) {
    env.statistics->asgViolations++;
  }
  return SimplifyingGeneratingInference1::Result{
    .simplified = Clause::fromStack(stack, inf), 
    .premiseRedundant = redundant
  };
}